

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void error_to_str_test(void)

{
  int iVar1;
  char *pcVar2;
  fdb_status err_code;
  timeval __test_begin;
  timeval tStack_28;
  
  gettimeofday(&tStack_28,(__timezone_ptr_t)0x0);
  memleak_start();
  err_code = ~FDB_RESULT_OPEN_FAIL;
  do {
    err_code = err_code + FDB_RESULT_INVALID_ARGS;
    pcVar2 = fdb_error_msg(err_code);
    iVar1 = strcmp(pcVar2,"unknown error");
    if (iVar1 == 0) {
      error_to_str_test();
    }
  } while (FDB_RESULT_ALREADY_COMPACTED < err_code);
  pcVar2 = fdb_error_msg(0xffffffb6);
  iVar1 = strcmp(pcVar2,"unknown error");
  if (iVar1 != 0) {
    error_to_str_test();
  }
  error_to_str_test();
  return;
}

Assistant:

void error_to_str_test()
{
    TEST_INIT();
    memleak_start();
    int i;
    const char *err_msg;

    for (i = FDB_RESULT_SUCCESS; i >= FDB_RESULT_LAST; --i) {
        err_msg = fdb_error_msg((fdb_status)i);
        // Verify that all error codes have corresponding error messages
        TEST_CHK(strcmp(err_msg, "unknown error"));
    }

    err_msg = fdb_error_msg((fdb_status)i);
    // Verify that the last error code has been checked
    TEST_CHK(!strcmp(err_msg, "unknown error"));

    memleak_end();
    TEST_RESULT("error to string message test");
}